

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O1

void show_cores(void)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  core *local_50;
  
  local_50 = first_state;
  if (first_state != (core *)0x0) {
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        putchar(10);
      }
      printf("state %d, number = %d, accessing symbol = %s\n",(ulong)uVar7,
             (ulong)(uint)local_50->number);
      iVar2 = local_50->nitems;
      if (0 < (long)iVar2) {
        lVar5 = 0;
        do {
          uVar4 = local_50->items[lVar5];
          printf("%4d  ",(ulong)uVar4);
          lVar6 = (long)(int)uVar4 * 4;
          do {
            lVar8 = lVar6;
            lVar6 = lVar8 + 4;
          } while (-1 < *(int *)((long)ritem + lVar8));
          printf("%s :",symbol_name[rlhs[(uint)-*(int *)((long)ritem + lVar8)]]);
          uVar3 = rrhs[-(long)*(int *)((long)ritem + lVar8)];
          uVar9 = (ulong)uVar3;
          if ((int)uVar3 < (int)uVar4) {
            uVar9 = (ulong)(int)uVar3;
            do {
              piVar1 = ritem + uVar9;
              uVar9 = uVar9 + 1;
              printf(" %s",symbol_name[*piVar1]);
            } while ((long)(int)uVar4 != uVar9);
          }
          printf(" .");
          uVar4 = ritem[(int)uVar9];
          if (-1 < (int)uVar4) {
            lVar6 = (long)(int)uVar9 * 4;
            do {
              lVar6 = lVar6 + 4;
              printf(" %s",symbol_name[uVar4]);
              uVar4 = *(uint *)((long)ritem + lVar6);
            } while (-1 < (int)uVar4);
          }
          putchar(10);
          fflush(_stdout);
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar2);
      }
      uVar7 = uVar7 + 1;
      local_50 = local_50->next;
    } while (local_50 != (core *)0x0);
  }
  return;
}

Assistant:

void show_cores()
{
    core *p;
    int i, j, k, n;
    int itemno;

    k = 0;
    for (p = first_state; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("state %d, number = %d, accessing symbol = %s\n",
		k, p->number, symbol_name[p->accessing_symbol]);
	n = p->nitems;
	for (i = 0; i < n; ++i)
	{
	    itemno = p->items[i];
	    printf("%4d  ", itemno);
	    j = itemno;
	    while (ritem[j] >= 0) ++j;
	    printf("%s :", symbol_name[rlhs[-ritem[j]]]);
	    j = rrhs[-ritem[j]];
	    while (j < itemno)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf(" .");
	    while (ritem[j] >= 0)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf("\n");
	    fflush(stdout);
	}
    }
}